

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,ReadOptions *options,BlockHandle *handle,
                  BlockContents *result)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  Status SVar4;
  char *pcVar5;
  uint32_t uVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Status s;
  Slice contents;
  Status local_98;
  Slice local_90;
  Slice local_80;
  Status local_70;
  char *local_68;
  ulong local_60;
  char *local_58;
  size_t sStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (result->data).data_ = "";
  (result->data).size_ = 0;
  result->cachable = false;
  result->heap_allocated = false;
  uVar3 = handle->size_;
  uVar1 = uVar3 + 5;
  pcVar7 = (char *)operator_new__(uVar1);
  local_68 = "";
  local_60 = 0;
  (*file->_vptr_RandomAccessFile[2])(&local_70,file,handle->offset_,uVar1,&local_68,pcVar7);
  pcVar5 = local_68;
  if (local_70.state_ == (char *)0x0) {
    if (local_60 == uVar1) {
      if ((options->verify_checksums == true) &&
         (iVar2 = *(int *)(local_68 + uVar3 + 1), uVar6 = crc32c::Value(local_68,uVar3 + 1),
         uVar6 != ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
        operator_delete__(pcVar7);
        local_80.data_ = "block checksum mismatch";
        local_80.size_ = 0x17;
        (*file->_vptr_RandomAccessFile[3])(&local_58,file);
        local_90.data_ = local_58;
        local_90.size_ = sStack_50;
        Status::Corruption(&local_98,&local_80,&local_90);
        SVar4.state_ = local_70.state_;
        local_70.state_ = local_98.state_;
        local_98.state_ = SVar4.state_;
        Status::~Status(&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        goto LAB_00560bfa;
      }
      if (pcVar5[uVar3] == '\x01') {
        operator_delete__(pcVar7);
        local_80.data_ = "corrupted compressed block contents";
        local_80.size_ = 0x23;
        (*file->_vptr_RandomAccessFile[3])(&local_58,file);
        local_90.data_ = local_58;
        local_90.size_ = sStack_50;
        Status::Corruption((Status *)this,&local_80,&local_90);
      }
      else {
        if (pcVar5[uVar3] == '\0') {
          bVar8 = pcVar5 == pcVar7;
          if (!bVar8) {
            operator_delete__(pcVar7);
            pcVar7 = pcVar5;
          }
          (result->data).data_ = pcVar7;
          (result->data).size_ = uVar3;
          result->heap_allocated = bVar8;
          result->cachable = bVar8;
          *(undefined8 *)this = 0;
          goto LAB_00560ce3;
        }
        operator_delete__(pcVar7);
        local_80.data_ = "bad block type";
        local_80.size_ = 0xe;
        (*file->_vptr_RandomAccessFile[3])(&local_58,file);
        local_90.data_ = local_58;
        local_90.size_ = sStack_50;
        Status::Corruption((Status *)this,&local_80,&local_90);
      }
    }
    else {
      operator_delete__(pcVar7);
      local_80.data_ = "truncated block read";
      local_80.size_ = 0x14;
      (*file->_vptr_RandomAccessFile[3])(&local_58,file);
      local_90.data_ = local_58;
      local_90.size_ = sStack_50;
      Status::Corruption((Status *)this,&local_80,&local_90);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    operator_delete__(pcVar7);
LAB_00560bfa:
    *(char **)this = local_70.state_;
    local_70.state_ = (char *)0x0;
  }
LAB_00560ce3:
  Status::~Status(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read", file->GetName());
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch", file->GetName());
      return s;
    }
  }

  switch (data[n]) {
    case kNoCompression:
      if (data != buf) {
        // File implementation gave us pointer to some other data.
        // Use it directly under the assumption that it will be live
        // while the file is open.
        delete[] buf;
        result->data = Slice(data, n);
        result->heap_allocated = false;
        result->cachable = false;  // Do not double-cache
      } else {
        result->data = Slice(buf, n);
        result->heap_allocated = true;
        result->cachable = true;
      }

      // Ok
      break;
    case kSnappyCompression: {
      size_t ulength = 0;
      if (!port::Snappy_GetUncompressedLength(data, n, &ulength)) {
        delete[] buf;
        return Status::Corruption("corrupted compressed block contents", file->GetName());
      }
      char* ubuf = new char[ulength];
      if (!port::Snappy_Uncompress(data, n, ubuf)) {
        delete[] buf;
        delete[] ubuf;
        return Status::Corruption("corrupted compressed block contents", file->GetName());
      }
      delete[] buf;
      result->data = Slice(ubuf, ulength);
      result->heap_allocated = true;
      result->cachable = true;
      break;
    }
    default:
      delete[] buf;
      return Status::Corruption("bad block type", file->GetName());
  }

  return Status::OK();
}